

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O1

int __thiscall spectest::JSONParser::ReadChar(JSONParser *this)

{
  anon_union_16_2_ecfd7102_for_Location_1 *paVar1;
  int *piVar2;
  ulong uVar3;
  pointer puVar4;
  size_t sVar5;
  char *pcVar6;
  undefined8 uVar7;
  int iVar8;
  
  uVar3 = this->json_offset_;
  puVar4 = (this->json_data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  iVar8 = -1;
  if (uVar3 < (ulong)((long)(this->json_data_).
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)puVar4)) {
    sVar5 = (this->loc_).filename._M_len;
    pcVar6 = (this->loc_).filename._M_str;
    uVar7 = *(undefined8 *)((long)&(this->loc_).field_1 + 8);
    (this->prev_loc_).field_1.field_1.offset = (this->loc_).field_1.field_1.offset;
    *(undefined8 *)((long)&(this->prev_loc_).field_1 + 8) = uVar7;
    (this->prev_loc_).filename._M_len = sVar5;
    (this->prev_loc_).filename._M_str = pcVar6;
    this->json_offset_ = uVar3 + 1;
    iVar8 = (int)(char)puVar4[uVar3];
    if (iVar8 == 10) {
      paVar1 = &(this->loc_).field_1;
      (paVar1->field_0).line = (paVar1->field_0).line + 1;
      (this->loc_).field_1.field_0.first_column = 1;
    }
    else {
      piVar2 = &(this->loc_).field_1.field_0.first_column;
      *piVar2 = *piVar2 + 1;
    }
    this->has_prev_loc_ = true;
  }
  return iVar8;
}

Assistant:

int JSONParser::ReadChar() {
  if (json_offset_ >= json_data_.size()) {
    return -1;
  }
  prev_loc_ = loc_;
  char c = json_data_[json_offset_++];
  if (c == '\n') {
    loc_.line++;
    loc_.first_column = 1;
  } else {
    loc_.first_column++;
  }
  has_prev_loc_ = true;
  return c;
}